

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall gl4cts::GPUShaderFP64Test10::prepareTypes(GPUShaderFP64Test10 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  *this_00;
  typeDetails tStack_48;
  
  this_00 = &this->m_types;
  typeDetails::typeDetails(&tStack_48,1,1);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  paVar1 = &tStack_48.m_type_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,1,2);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,1,3);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,1,4);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,2,2);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,2,3);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,2,4);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,3,2);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,3,3);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,3,4);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,4,2);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,4,3);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  typeDetails::typeDetails(&tStack_48,4,4);
  std::
  vector<gl4cts::GPUShaderFP64Test10::typeDetails,_std::allocator<gl4cts::GPUShaderFP64Test10::typeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test10::typeDetails>(this_00,&tStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(tStack_48.m_type_name._M_dataplus._M_p,
                    tStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareTypes()
{
	m_types.push_back(typeDetails(1 /* n_columns */, 1 /* n_rows */));
	m_types.push_back(typeDetails(1 /* n_columns */, 2 /* n_rows */));
	m_types.push_back(typeDetails(1 /* n_columns */, 3 /* n_rows */));
	m_types.push_back(typeDetails(1 /* n_columns */, 4 /* n_rows */));
	m_types.push_back(typeDetails(2 /* n_columns */, 2 /* n_rows */));
	m_types.push_back(typeDetails(2 /* n_columns */, 3 /* n_rows */));
	m_types.push_back(typeDetails(2 /* n_columns */, 4 /* n_rows */));
	m_types.push_back(typeDetails(3 /* n_columns */, 2 /* n_rows */));
	m_types.push_back(typeDetails(3 /* n_columns */, 3 /* n_rows */));
	m_types.push_back(typeDetails(3 /* n_columns */, 4 /* n_rows */));
	m_types.push_back(typeDetails(4 /* n_columns */, 2 /* n_rows */));
	m_types.push_back(typeDetails(4 /* n_columns */, 3 /* n_rows */));
	m_types.push_back(typeDetails(4 /* n_columns */, 4 /* n_rows */));
}